

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicMinCase::verify
          (ShaderAtomicMinCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  deUint32 needle;
  Precision precision;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int in_stack_00000008;
  deUint32 outputValue;
  long in_stack_00000010;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> outValues;
  set<int,_std::less<int>,_std::allocator<int>_> inValues;
  deInt32 inputValue;
  deUint32 local_26c;
  Hex<8UL> local_268;
  int local_260;
  uint local_25c;
  int local_258;
  int local_254;
  undefined8 local_250;
  ulong local_248;
  int local_23c;
  int local_238;
  int local_234;
  ulong local_230;
  ulong local_228;
  size_t local_220;
  size_t local_218;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_210;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_258 = (int)tbs;
  local_254 = (int)sig;
  lVar5 = 0;
  local_25c = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar7 = local_25c;
    uVar3 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar5 + 1];
    local_25c = uVar3 * uVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  local_228 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)local_25c;
  if ((int)local_228 < 1) {
    uVar3 = (uint)CONCAT71((uint7)(local_228 >> 8) & 0xffffff,1);
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_228 = local_228 & 0xffffffff;
    local_230 = (ulong)local_25c;
    local_23c = local_254 * uVar7 * uVar3;
    local_238 = uVar7 * local_258 * uVar3;
    local_260 = 0;
    iVar8 = 0;
    local_248 = 0;
    local_250 = 0;
    local_220 = tbslen;
    local_218 = siglen;
    do {
      uVar3 = *(uint *)(in_stack_00000010 + (int)local_248 * in_stack_00000008);
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e0._M_impl.super__Rb_tree_header._M_header;
      local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_210._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_210._M_impl.super__Rb_tree_header._M_header;
      local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar7 = (this->super_ShaderAtomicOpCase).m_initialValue;
      uVar6 = local_230;
      local_234 = iVar8;
      local_210._M_impl.super__Rb_tree_header._M_header._M_right =
           local_210._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < (int)local_25c) {
        do {
          local_1b0._0_4_ = *(undefined4 *)(local_218 + (long)iVar8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_1e0,(int *)local_1b0);
          if ((int)local_1b0._0_4_ < (int)uVar7) {
            uVar7 = local_1b0._0_4_;
          }
          iVar8 = iVar8 + local_254;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      bVar2 = intEqualsAfterUintCast(uVar7,uVar3,(this->super_ShaderAtomicOpCase).m_precision);
      if (!bVar2) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,(int)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,": expected minimum ",0x13);
        std::ostream::operator<<(poVar1,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        local_268.value = (deUint64)uVar7;
        tcu::Format::Hex<8UL>::toStream(&local_268,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        local_268.value = (ulong)uVar3;
        tcu::Format::Hex<8UL>::toStream(&local_268,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        uVar4 = std::ios_base::~ios_base(local_138);
        local_250 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
      }
      if (0 < (int)local_25c) {
        uVar6 = 0;
        iVar8 = local_260;
        do {
          needle = *(deUint32 *)(local_220 + (long)iVar8);
          precision = (this->super_ShaderAtomicOpCase).m_precision;
          local_26c = needle;
          bVar2 = containsAfterUintCast
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1e0,needle,
                             precision);
          if (!bVar2) {
            bVar2 = intEqualsAfterUintCast
                              ((this->super_ShaderAtomicOpCase).m_initialValue,needle,precision);
            if (!bVar2) {
              local_1b0._0_8_ =
                   ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"ERROR: at group ",0x10);
              std::ostream::operator<<(this_00,(int)local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,", invocation ",0xd);
              std::ostream::operator<<(this_00,(int)uVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,": found unexpected value ",0x19);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," (",2);
              local_268.value = (deUint64)local_26c;
              tcu::Format::Hex<8UL>::toStream(&local_268,(ostream *)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              uVar4 = std::ios_base::~ios_base(local_138);
              local_250 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_210,&local_26c);
          uVar6 = uVar6 + 1;
          iVar8 = iVar8 + local_258;
        } while (local_230 != uVar6);
      }
      bVar2 = containsAfterUintCast
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_210,(this->super_ShaderAtomicOpCase).m_initialValue,
                         (this->super_ShaderAtomicOpCase).m_precision);
      uVar6 = local_248;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      if (!bVar2) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: could not find initial value from group ",0x2f);
        std::ostream::operator<<(poVar1,(int)uVar6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        uVar4 = std::ios_base::~ios_base(local_138);
        local_250 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_210);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1e0);
      local_248 = uVar6 + 1;
      iVar8 = local_234 + local_23c;
      local_260 = local_260 + local_238;
    } while (local_248 != local_228);
    uVar3 = (uint)local_250 ^ 1;
  }
  return uVar3 & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;
		bool		anyError		= false;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<deInt32>	inValues;
			set<deUint32>	outValues;
			int				minValue		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deInt32 inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				inValues.insert(inputValue);
				minValue = de::min(inputValue, minValue);
			}

			if (!intEqualsAfterUintCast(minValue, groupOutput, m_precision))
			{
				m_testCtx.getLog()
					<< TestLog::Message
					<< "ERROR: at group " << groupNdx
					<< ": expected minimum " << minValue << " (" << tcu::Format::Hex<8>((deUint32)minValue) << ")"
					<< ", got " << groupOutput << " (" << tcu::Format::Hex<8>(groupOutput) << ")"
					<< TestLog::EndMessage;
				anyError = true;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!containsAfterUintCast(inValues, outputValue, m_precision) &&
					!intEqualsAfterUintCast((deInt32)m_initialValue, outputValue, m_precision))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
														   << " (" << tcu::Format::Hex<8>(outputValue) << ")"
									   << TestLog::EndMessage;
					anyError = true;
				}

				outValues.insert(outputValue);
			}

			if (!containsAfterUintCast(outValues, (int)m_initialValue, m_precision))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				anyError = true;
			}
		}

		return !anyError;
	}